

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall
testing::internal::FilePath::RemoveTrailingPathSeparator
          (FilePath *__return_storage_ptr__,FilePath *this)

{
  bool bVar1;
  string local_38;
  FilePath *local_18;
  FilePath *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = IsDirectory(this);
  if (bVar1) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    FilePath(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    FilePath(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory() ? FilePath(pathname_.substr(0, pathname_.length() - 1))
                       : *this;
}